

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O1

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF::Node> *ptr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Node *pNVar15;
  pointer pRVar16;
  pointer pRVar17;
  pointer pRVar18;
  pointer puVar19;
  aiNode *this;
  ulong uVar20;
  aiNode **ppaVar21;
  aiNode *paVar22;
  uint *puVar23;
  pointer pRVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  
  pNVar15 = (ptr->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start[ptr->index];
  this = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this,&(pNVar15->super_Object).id);
  pRVar16 = *(pointer *)
             &(pNVar15->children).
              super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
              _M_impl;
  pRVar17 = *(pointer *)
             ((long)&(pNVar15->children).
                     super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
             + 8);
  if (pRVar16 != pRVar17) {
    uVar20 = (long)pRVar17 - (long)pRVar16;
    uVar27 = (uint)(uVar20 >> 4);
    this->mNumChildren = uVar27;
    ppaVar21 = (aiNode **)operator_new__(uVar20 >> 1 & 0x7fffffff8);
    this->mChildren = ppaVar21;
    if (uVar27 != 0) {
      lVar26 = 0;
      uVar20 = 0;
      do {
        paVar22 = ImportNode(pScene,r,meshOffsets,
                             (Ref<glTF::Node> *)
                             (*(long *)&(pNVar15->children).
                                        super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                                        ._M_impl + lVar26));
        paVar22->mParent = this;
        this->mChildren[uVar20] = paVar22;
        uVar20 = uVar20 + 1;
        lVar26 = lVar26 + 0x10;
      } while (uVar20 < this->mNumChildren);
    }
  }
  if ((pNVar15->matrix).isPresent == true) {
    (this->mTransformation).a1 = (pNVar15->matrix).value[0];
    (this->mTransformation).b1 = *(float *)((long)(pNVar15->matrix).value + 4);
    (this->mTransformation).c1 = *(float *)((long)(pNVar15->matrix).value + 8);
    (this->mTransformation).d1 = *(float *)((long)(pNVar15->matrix).value + 0xc);
    (this->mTransformation).a2 = *(float *)((long)(pNVar15->matrix).value + 0x10);
    (this->mTransformation).b2 = *(float *)((long)(pNVar15->matrix).value + 0x14);
    (this->mTransformation).c2 = *(float *)((long)(pNVar15->matrix).value + 0x18);
    (this->mTransformation).d2 = *(float *)((long)(pNVar15->matrix).value + 0x1c);
    (this->mTransformation).a3 = *(float *)((long)(pNVar15->matrix).value + 0x20);
    (this->mTransformation).b3 = *(float *)((long)(pNVar15->matrix).value + 0x24);
    (this->mTransformation).c3 = *(float *)((long)(pNVar15->matrix).value + 0x28);
    (this->mTransformation).d3 = *(float *)((long)(pNVar15->matrix).value + 0x2c);
    (this->mTransformation).a4 = *(float *)((long)(pNVar15->matrix).value + 0x30);
    (this->mTransformation).b4 = *(float *)((long)(pNVar15->matrix).value + 0x34);
    (this->mTransformation).c4 = *(float *)((long)(pNVar15->matrix).value + 0x38);
    (this->mTransformation).d4 = *(float *)((long)(pNVar15->matrix).value + 0x3c);
  }
  else {
    if ((pNVar15->translation).isPresent == true) {
      fVar40 = (pNVar15->translation).value[0];
      fVar1 = (this->mTransformation).b1;
      fVar29 = fVar1 * 0.0;
      fVar2 = (this->mTransformation).a1;
      fVar3 = (this->mTransformation).a2;
      fVar33 = (this->mTransformation).c1;
      fVar32 = fVar33 * 0.0;
      fVar4 = (this->mTransformation).d1;
      fVar5 = (this->mTransformation).b2;
      fVar30 = fVar5 * 0.0;
      fVar6 = (this->mTransformation).c2;
      fVar47 = fVar6 * 0.0;
      fVar7 = (this->mTransformation).d2;
      fVar8 = (this->mTransformation).b3;
      fVar31 = fVar8 * 0.0;
      fVar9 = (this->mTransformation).a3;
      fVar10 = (this->mTransformation).c3;
      fVar51 = fVar10 * 0.0;
      fVar11 = (this->mTransformation).d3;
      fVar12 = (this->mTransformation).b4;
      fVar45 = fVar12 * 0.0;
      fVar13 = (this->mTransformation).a4;
      fVar14 = (this->mTransformation).c4;
      fVar46 = fVar14 * 0.0;
      fVar28 = (this->mTransformation).d4;
      fVar43 = fVar2 * 0.0;
      fVar34 = *(float *)((long)(pNVar15->translation).value + 4);
      fVar38 = fVar3 * 0.0;
      fVar36 = fVar9 * 0.0;
      fVar41 = fVar13 * 0.0;
      fVar44 = fVar43 + fVar29;
      fVar35 = *(float *)((long)(pNVar15->translation).value + 8);
      fVar39 = fVar38 + fVar30;
      fVar37 = fVar36 + fVar31;
      fVar42 = fVar41 + fVar45;
      (this->mTransformation).a1 = fVar4 * fVar40 + fVar2 + fVar29 + fVar32;
      (this->mTransformation).a2 = fVar7 * fVar40 + fVar3 + fVar30 + fVar47;
      (this->mTransformation).a3 = fVar11 * fVar40 + fVar9 + fVar31 + fVar51;
      (this->mTransformation).a4 = fVar40 * fVar28 + fVar13 + fVar45 + fVar46;
      (this->mTransformation).b1 = fVar4 * fVar34 + fVar1 + fVar43 + fVar32;
      (this->mTransformation).b2 = fVar7 * fVar34 + fVar5 + fVar38 + fVar47;
      (this->mTransformation).b3 = fVar11 * fVar34 + fVar8 + fVar36 + fVar51;
      (this->mTransformation).b4 = fVar34 * fVar28 + fVar12 + fVar41 + fVar46;
      (this->mTransformation).c1 = fVar4 * fVar35 + fVar33 + fVar44;
      (this->mTransformation).c2 = fVar7 * fVar35 + fVar6 + fVar39;
      (this->mTransformation).c3 = fVar11 * fVar35 + fVar10 + fVar37;
      (this->mTransformation).c4 = fVar35 * fVar28 + fVar14 + fVar42;
      (this->mTransformation).d1 = fVar44 + fVar32 + fVar4;
      (this->mTransformation).d2 = fVar39 + fVar47 + fVar7;
      (this->mTransformation).d3 = fVar37 + fVar51 + fVar11;
      (this->mTransformation).d4 = fVar42 + fVar46 + fVar28;
    }
    if ((pNVar15->scale).isPresent == true) {
      fVar40 = (pNVar15->scale).value[0];
      fVar1 = *(float *)((long)(pNVar15->scale).value + 4);
      fVar2 = *(float *)((long)(pNVar15->scale).value + 8);
      fVar3 = (this->mTransformation).b1;
      fVar51 = fVar3 * 0.0;
      fVar33 = (this->mTransformation).a1;
      fVar4 = (this->mTransformation).a2;
      fVar5 = (this->mTransformation).c1;
      fVar6 = (this->mTransformation).b2;
      fVar48 = fVar6 * 0.0;
      fVar7 = (this->mTransformation).a3;
      fVar8 = (this->mTransformation).b3;
      fVar52 = fVar8 * 0.0;
      fVar31 = fVar33 * 0.0;
      fVar32 = fVar31 + fVar51;
      fVar37 = fVar4 * 0.0;
      fVar38 = fVar37 + fVar48;
      fVar9 = (this->mTransformation).a4;
      fVar43 = fVar7 * 0.0;
      fVar44 = fVar43 + fVar52;
      fVar10 = (this->mTransformation).b4;
      fVar29 = fVar10 * 0.0;
      fVar49 = fVar9 * 0.0;
      fVar50 = fVar49 + fVar29;
      fVar11 = (this->mTransformation).c2;
      fVar12 = (this->mTransformation).c3;
      fVar13 = (this->mTransformation).c4;
      fVar45 = fVar5 * 0.0;
      fVar14 = (this->mTransformation).d1;
      fVar47 = fVar14 * 0.0;
      fVar42 = fVar11 * 0.0;
      fVar28 = (this->mTransformation).d2;
      fVar46 = fVar28 * 0.0;
      fVar41 = fVar12 * 0.0;
      fVar34 = (this->mTransformation).d3;
      fVar36 = fVar34 * 0.0;
      fVar39 = fVar13 * 0.0;
      fVar35 = (this->mTransformation).d4;
      fVar30 = fVar35 * 0.0;
      (this->mTransformation).a1 = fVar33 * fVar40 + fVar51 + fVar45 + fVar47;
      (this->mTransformation).a2 = fVar4 * fVar40 + fVar48 + fVar42 + fVar46;
      (this->mTransformation).a3 = fVar7 * fVar40 + fVar52 + fVar41 + fVar36;
      (this->mTransformation).a4 = fVar40 * fVar9 + fVar29 + fVar39 + fVar30;
      (this->mTransformation).b1 = fVar3 * fVar1 + fVar31 + fVar45 + fVar47;
      (this->mTransformation).b2 = fVar6 * fVar1 + fVar37 + fVar42 + fVar46;
      (this->mTransformation).b3 = fVar8 * fVar1 + fVar43 + fVar41 + fVar36;
      (this->mTransformation).b4 = fVar1 * fVar10 + fVar49 + fVar39 + fVar30;
      (this->mTransformation).c1 = fVar5 * fVar2 + fVar32 + fVar47;
      (this->mTransformation).c2 = fVar11 * fVar2 + fVar38 + fVar46;
      (this->mTransformation).c3 = fVar12 * fVar2 + fVar44 + fVar36;
      (this->mTransformation).c4 = fVar13 * fVar2 + fVar50 + fVar30;
      (this->mTransformation).d1 = fVar32 + fVar45 + fVar14;
      (this->mTransformation).d2 = fVar38 + fVar42 + fVar28;
      (this->mTransformation).d3 = fVar44 + fVar41 + fVar34;
      (this->mTransformation).d4 = fVar50 + fVar39 + fVar35;
    }
    if ((pNVar15->rotation).isPresent == true) {
      fVar40 = (pNVar15->rotation).value[0];
      fVar1 = *(float *)((long)(pNVar15->rotation).value + 4);
      fVar2 = *(float *)((long)(pNVar15->rotation).value + 8);
      fVar3 = *(float *)((long)(pNVar15->rotation).value + 0xc);
      fVar33 = fVar1 * fVar1 + fVar2 * fVar2;
      fVar28 = 1.0 - (fVar33 + fVar33);
      fVar34 = fVar40 * fVar1 - fVar2 * fVar3;
      fVar34 = fVar34 + fVar34;
      fVar36 = fVar40 * fVar2 + fVar1 * fVar3;
      fVar36 = fVar36 + fVar36;
      fVar42 = fVar2 * fVar3 + fVar40 * fVar1;
      fVar33 = fVar2 * fVar2 + fVar40 * fVar40;
      fVar37 = 1.0 - (fVar33 + fVar33);
      fVar30 = fVar1 * fVar2 - fVar40 * fVar3;
      fVar38 = fVar40 * fVar2 - fVar1 * fVar3;
      fVar32 = fVar40 * fVar3 + fVar1 * fVar2;
      fVar40 = fVar40 * fVar40 + fVar1 * fVar1;
      fVar41 = 1.0 - (fVar40 + fVar40);
      fVar40 = (this->mTransformation).b1;
      fVar1 = (this->mTransformation).a1;
      fVar2 = (this->mTransformation).a2;
      fVar3 = (this->mTransformation).c1;
      fVar33 = (this->mTransformation).b2;
      fVar4 = (this->mTransformation).c2;
      fVar5 = (this->mTransformation).b3;
      fVar6 = (this->mTransformation).a3;
      fVar7 = (this->mTransformation).c3;
      fVar8 = (this->mTransformation).b4;
      fVar9 = (this->mTransformation).a4;
      fVar10 = (this->mTransformation).c4;
      fVar32 = fVar32 + fVar32;
      fVar42 = fVar42 + fVar42;
      fVar38 = fVar38 + fVar38;
      fVar30 = fVar30 + fVar30;
      fVar11 = (this->mTransformation).d1;
      fVar39 = fVar11 * 0.0;
      fVar12 = (this->mTransformation).d2;
      fVar35 = fVar12 * 0.0;
      fVar13 = (this->mTransformation).d3;
      fVar29 = fVar13 * 0.0;
      fVar14 = (this->mTransformation).d4;
      fVar31 = fVar14 * 0.0;
      (this->mTransformation).a1 = fVar3 * fVar36 + fVar1 * fVar28 + fVar40 * fVar34 + fVar39;
      (this->mTransformation).a2 = fVar4 * fVar36 + fVar2 * fVar28 + fVar34 * fVar33 + fVar35;
      (this->mTransformation).a3 = fVar7 * fVar36 + fVar6 * fVar28 + fVar34 * fVar5 + fVar29;
      (this->mTransformation).a4 = fVar36 * fVar10 + fVar28 * fVar9 + fVar34 * fVar8 + fVar31;
      (this->mTransformation).b1 = fVar3 * fVar30 + fVar1 * fVar42 + fVar40 * fVar37 + fVar39;
      (this->mTransformation).b2 = fVar4 * fVar30 + fVar2 * fVar42 + fVar37 * fVar33 + fVar35;
      (this->mTransformation).b3 = fVar7 * fVar30 + fVar6 * fVar42 + fVar37 * fVar5 + fVar29;
      (this->mTransformation).b4 = fVar30 * fVar10 + fVar42 * fVar9 + fVar37 * fVar8 + fVar31;
      (this->mTransformation).c1 = fVar3 * fVar41 + fVar1 * fVar38 + fVar40 * fVar32 + fVar39;
      (this->mTransformation).c2 = fVar4 * fVar41 + fVar2 * fVar38 + fVar32 * fVar33 + fVar35;
      (this->mTransformation).c3 = fVar7 * fVar41 + fVar6 * fVar38 + fVar32 * fVar5 + fVar29;
      (this->mTransformation).c4 = fVar41 * fVar10 + fVar38 * fVar9 + fVar32 * fVar8 + fVar31;
      (this->mTransformation).d1 = fVar3 * 0.0 + fVar1 * 0.0 + fVar40 * 0.0 + fVar11;
      (this->mTransformation).d2 = fVar4 * 0.0 + fVar2 * 0.0 + fVar33 * 0.0 + fVar12;
      (this->mTransformation).d3 = fVar7 * 0.0 + fVar6 * 0.0 + fVar5 * 0.0 + fVar13;
      (this->mTransformation).d4 = fVar10 * 0.0 + fVar9 * 0.0 + fVar8 * 0.0 + fVar14;
    }
  }
  pRVar24 = *(pointer *)
             &(pNVar15->meshes).
              super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>.
              _M_impl;
  pRVar18 = *(pointer *)
             ((long)&(pNVar15->meshes).
                     super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
             + 8);
  if (pRVar24 != pRVar18) {
    lVar26 = (long)pRVar18 - (long)pRVar24 >> 4;
    puVar19 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar26 = lVar26 + (ulong)(lVar26 == 0);
    puVar23 = &pRVar24->index;
    uVar27 = 0;
    do {
      uVar27 = (uVar27 + puVar19[(long)(int)*puVar23 + 1]) - puVar19[(int)*puVar23];
      puVar23 = puVar23 + 4;
      lVar26 = lVar26 + -1;
    } while (lVar26 != 0);
    this->mNumMeshes = uVar27;
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)uVar27) {
      uVar20 = (long)(int)uVar27 * 4;
    }
    puVar23 = (uint *)operator_new__(uVar20);
    this->mMeshes = puVar23;
    pRVar24 = *(pointer *)
               &(pNVar15->meshes).
                super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>.
                _M_impl;
    if (*(pointer *)
         ((long)&(pNVar15->meshes).
                 super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
         + 8) != pRVar24) {
      uVar20 = 0;
      lVar26 = 0;
      do {
        lVar25 = (long)(int)pRVar24[uVar20].index;
        puVar19 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar27 = puVar19[lVar25];
        if (uVar27 < puVar19[lVar25 + 1]) {
          lVar26 = (long)(int)lVar26;
          do {
            this->mMeshes[lVar26] = uVar27;
            uVar27 = uVar27 + 1;
            lVar26 = lVar26 + 1;
          } while (uVar27 < (meshOffsets->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[lVar25 + 1]);
        }
        uVar20 = uVar20 + 1;
        pRVar24 = *(pointer *)
                   &(pNVar15->meshes).
                    super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                    ._M_impl;
      } while (uVar20 < (ulong)((long)*(pointer *)
                                       ((long)&(pNVar15->meshes).
                                               super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                                       + 8) - (long)pRVar24 >> 4));
    }
  }
  if (((pNVar15->camera).vector != (vector<glTF::Camera_*,_std::allocator<glTF::Camera_*>_> *)0x0)
     && (paVar22 = (aiNode *)pScene->mCameras[(pNVar15->camera).index], paVar22 != this)) {
    uVar27 = (this->mName).length;
    (paVar22->mName).length = uVar27;
    memcpy((paVar22->mName).data,(this->mName).data,(ulong)uVar27);
    (paVar22->mName).data[uVar27] = '\0';
  }
  if (((pNVar15->light).vector != (vector<glTF::Light_*,_std::allocator<glTF::Light_*>_> *)0x0) &&
     (paVar22 = (aiNode *)pScene->mLights[(pNVar15->light).index], paVar22 != this)) {
    uVar27 = (this->mName).length;
    (paVar22->mName).length = uVar27;
    memcpy((paVar22->mName).data,(this->mName).data,(ulong)uVar27);
    (paVar22->mName).data[uVar27] = '\0';
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF::Asset& r, std::vector<unsigned int>& meshOffsets, glTF::Ref<glTF::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(node.id);

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    aiMatrix4x4& matrix = ainode->mTransformation;
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = t * matrix;
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = s * matrix;
        }


        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = aiMatrix4x4(rot.GetMatrix()) * matrix;
        }
    }

    if (!node.meshes.empty()) {
        int count = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            count += meshOffsets[idx + 1] - meshOffsets[idx];
        }

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        int k = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            for (unsigned int j = meshOffsets[idx]; j < meshOffsets[idx + 1]; ++j, ++k) {
                ainode->mMeshes[k] = j;
            }
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;
    }

    return ainode;
}